

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

int Abc_NtkPartitionSmartFindPart
              (Vec_Ptr_t *vPartSuppsAll,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsChar,
              int nSuppSizeLimit,Vec_Int_t *vOne)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  uint *pBuffer;
  int local_5c;
  int iBest;
  int nCommon;
  int i;
  int ValueBest;
  int Value;
  int Repulse;
  int Attract;
  Vec_Int_t *vPartSupp;
  Vec_Int_t *vOne_local;
  int nSuppSizeLimit_local;
  Vec_Ptr_t *vPartSuppsChar_local;
  Vec_Ptr_t *vPartsAll_local;
  Vec_Ptr_t *vPartSuppsAll_local;
  
  local_5c = -1;
  nCommon = 0;
  iBest = 0;
  do {
    iVar1 = Vec_PtrSize(vPartSuppsAll);
    if (iVar1 <= iBest) {
      if (nCommon < 0x4b) {
        vPartSuppsAll_local._4_4_ = -1;
      }
      else {
        vPartSuppsAll_local._4_4_ = local_5c;
      }
      return vPartSuppsAll_local._4_4_;
    }
    p = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,iBest);
    pBuffer = (uint *)Vec_PtrEntry(vPartSuppsChar,iBest);
    iVar1 = Abc_NtkSuppCharCommon(pBuffer,vOne);
    if (iVar1 != 0) {
      iVar2 = Vec_IntSize(vOne);
      if (iVar1 == iVar2) {
        return iBest;
      }
      if ((nSuppSizeLimit < 1) ||
         (iVar2 = Vec_IntSize(p),
         SBORROW4(iVar2,nSuppSizeLimit * 2) != iVar2 + nSuppSizeLimit * -2 < 0)) {
        iVar2 = Vec_IntSize(vOne);
        iVar3 = Vec_IntSize(p);
        if (iVar3 < 100) {
          ValueBest = 1;
        }
        else {
          iVar3 = Vec_IntSize(p);
          iVar3 = Abc_Base2Log(iVar3 - 100);
          ValueBest = iVar3 + 1;
        }
        iVar1 = ((iVar1 * 1000) / iVar2) / ValueBest;
        if (nCommon < iVar1) {
          local_5c = iBest;
          nCommon = iVar1;
        }
      }
    }
    iBest = iBest + 1;
  } while( true );
}

Assistant:

int Abc_NtkPartitionSmartFindPart( Vec_Ptr_t * vPartSuppsAll, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsChar, int nSuppSizeLimit, Vec_Int_t * vOne )
{
/*
    Vec_Int_t * vPartSupp, * vPart;
    double Attract, Repulse, Cost, CostBest;
    int i, nCommon, iBest;
    iBest = -1;
    CostBest = 0.0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vPartSupp, i )
    {
        vPart = Vec_PtrEntry( vPartsAll, i );
        if ( nPartSizeLimit > 0 && Vec_IntSize(vPart) >= nPartSizeLimit )
            continue;
        nCommon = Vec_IntTwoCountCommon( vPartSupp, vOne );
        if ( nCommon == 0 )
            continue;
        if ( nCommon == Vec_IntSize(vOne) )
            return i;
        Attract = 1.0 * nCommon / Vec_IntSize(vOne);
        if ( Vec_IntSize(vPartSupp) < 100 )
            Repulse = 1.0;
        else
            Repulse = log10( Vec_IntSize(vPartSupp) / 10.0 );
        Cost = pow( Attract, pow(Repulse, 5.0) );
        if ( CostBest < Cost )
        {
            CostBest = Cost;
            iBest = i;
        }
    }
    if ( CostBest < 0.6 )
        return -1;
    return iBest;
*/

    Vec_Int_t * vPartSupp;//, * vPart;
    int Attract, Repulse, Value, ValueBest;
    int i, nCommon, iBest;
//    int nCommon2;
    iBest = -1;
    ValueBest = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vPartSupp, i )
    {
        // skip partitions with too many outputs
//        vPart = Vec_PtrEntry( vPartsAll, i );
//        if ( nSuppSizeLimit > 0 && Vec_IntSize(vPart) >= nSuppSizeLimit )
//            continue;
        // find the number of common variables between this output and the partitions
//        nCommon2 = Vec_IntTwoCountCommon( vPartSupp, vOne );
        nCommon = Abc_NtkSuppCharCommon( (unsigned *)Vec_PtrEntry(vPartSuppsChar, i), vOne );
//        assert( nCommon2 == nCommon );
        // if no common variables, continue searching
        if ( nCommon == 0 )
            continue;
        // if all variables are common, the best partition if found
        if ( nCommon == Vec_IntSize(vOne) )
            return i;
        // skip partitions whose size exceeds the limit
        if ( nSuppSizeLimit > 0 && Vec_IntSize(vPartSupp) >= 2 * nSuppSizeLimit )
            continue;
        // figure out might be the good partition for this one
        Attract = 1000 * nCommon / Vec_IntSize(vOne);
        if ( Vec_IntSize(vPartSupp) < 100 )
            Repulse = 1;
        else
            Repulse = 1+Abc_Base2Log(Vec_IntSize(vPartSupp)-100);
        Value = Attract/Repulse;
        if ( ValueBest < Value )
        {
            ValueBest = Value;
            iBest = i;
        }
    }
    if ( ValueBest < 75 )
        return -1;
    return iBest;
}